

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O3

void Cba_FonSetName(Cba_Ntk_t *p,int f,int x)

{
  int Fill;
  char *__assertion;
  
  if ((p->vFonName).nSize < 1) {
    __assertion = "Cba_NtkHasFonNames(p)";
  }
  else if (f < 1) {
    __assertion = "Cba_FonIsReal(f)";
  }
  else {
    Vec_IntFillExtra(&p->vFonName,f + 1,x);
    if ((p->vFonName).nSize <= f) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    if ((p->vFonName).pArray[(uint)f] == 0) {
      Vec_IntFillExtra(&p->vFonName,f + 1,Fill);
      if (f < (p->vFonName).nSize) {
        (p->vFonName).pArray[(uint)f] = x;
        return;
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    __assertion = "Cba_FonName(p, f) == 0";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                ,0x18c,"void Cba_FonSetName(Cba_Ntk_t *, int, int)");
}

Assistant:

static inline void           Cba_FonSetName( Cba_Ntk_t * p, int f, int x )   { assert(Cba_NtkHasFonNames(p)); assert(Cba_FonIsReal(f)); assert(Cba_FonName(p, f) == 0); Vec_IntSetEntry(&p->vFonName, f, x); }